

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O0

void __thiscall QRasterPaintEngine::fillRect(QRasterPaintEngine *this,QRectF *r,QSpanData *data)

{
  bool bVar1;
  TransformationType TVar2;
  QRasterPaintEnginePrivate *pQVar3;
  QRasterPaintEngineState *pQVar4;
  undefined8 in_RDX;
  QRectF *in_RSI;
  QRasterPaintEnginePrivate *in_RDI;
  long in_FS_OFFSET;
  uint txop;
  QRasterPaintEngineState *s;
  QRasterPaintEnginePrivate *d;
  QPainterPath path;
  QPointF b;
  QPointF a;
  QRectF nr;
  QRect rr_1;
  QRect rr;
  undefined1 in_stack_0000023f;
  qreal in_stack_00000240;
  QPointF *in_stack_00000248;
  QPointF *in_stack_00000250;
  QRasterizer *in_stack_00000258;
  QRectF *in_stack_fffffffffffffe60;
  QPointF *p2;
  QRectF *in_stack_fffffffffffffe68;
  QRectF *in_stack_fffffffffffffe70;
  QSpanData *in_stack_fffffffffffffe80;
  QRasterPaintEnginePrivate *this_00;
  undefined1 *local_140;
  QPointF local_138;
  QPointF local_128;
  undefined1 in_stack_fffffffffffffee8 [16];
  QRect *in_stack_fffffffffffffef8;
  QRectF local_98 [2];
  undefined1 local_58 [48];
  undefined1 local_28 [16];
  QRect local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar3 = d_func((QRasterPaintEngine *)0x568b5a);
  pQVar4 = state((QRasterPaintEngine *)0x568b69);
  if ((*(ushort *)&pQVar4->field_12 >> 3 & 1) == 0) {
    TVar2 = QTransform::type((QTransform *)in_stack_fffffffffffffe68);
    if (TVar2 == TxNone) {
      local_18 = toNormalizedFillRect
                           ((QRasterPaintEngine *)in_stack_fffffffffffffe68,
                            in_stack_fffffffffffffe60);
      fillRect_normalized(in_stack_fffffffffffffef8,in_stack_fffffffffffffee8._8_8_,
                          in_stack_fffffffffffffee8._0_8_);
      goto LAB_0056901f;
    }
    if (TVar2 == TxTranslate) {
      local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTransform::dx(&(pQVar4->super_QPainterState).matrix);
      QTransform::dy(&(pQVar4->super_QPainterState).matrix);
      QRectF::translated(in_stack_fffffffffffffe70,(qreal)in_stack_fffffffffffffe68,
                         (qreal)in_stack_fffffffffffffe60);
      local_28 = (undefined1  [16])
                 toNormalizedFillRect
                           ((QRasterPaintEngine *)in_stack_fffffffffffffe68,
                            in_stack_fffffffffffffe60);
      fillRect_normalized(in_stack_fffffffffffffef8,in_stack_fffffffffffffee8._8_8_,
                          in_stack_fffffffffffffee8._0_8_);
      goto LAB_0056901f;
    }
    if (TVar2 == TxScale) {
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTransform::mapRect((QTransform *)in_stack_fffffffffffffef8,in_stack_fffffffffffffee8._8_8_);
      local_58._0_16_ =
           (undefined1  [16])
           toNormalizedFillRect
                     ((QRasterPaintEngine *)in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
      fillRect_normalized(in_stack_fffffffffffffef8,in_stack_fffffffffffffee8._8_8_,
                          in_stack_fffffffffffffee8._0_8_);
      goto LAB_0056901f;
    }
  }
  ensureRasterState((QRasterPaintEngine *)in_stack_fffffffffffffe60);
  if ((*(ushort *)&pQVar4->field_12 >> 6 & 1) == 0) {
    local_140 = &DAT_aaaaaaaaaaaaaaaa;
    QPainterPath::QPainterPath((QPainterPath *)0x568fe4);
    QPainterPath::addRect((QPainterPath *)this_00,in_RSI);
    ensureOutlineMapper((QRasterPaintEngine *)in_stack_fffffffffffffe60);
    (*(in_RDI->super_QPaintEngineExPrivate).super_QPaintEnginePrivate._vptr_QPaintEnginePrivate
      [0x36])(in_RDI,&local_140,in_RDX);
    QPainterPath::~QPainterPath((QPainterPath *)0x56901f);
  }
  else {
    QRasterPaintEnginePrivate::initializeRasterizer(in_RDI,in_stack_fffffffffffffe80);
    local_98[0].xp = -NAN;
    local_98[0].yp = -NAN;
    local_98[0].w = -NAN;
    local_98[0].h = -NAN;
    QRectF::normalized();
    bVar1 = QRectF::isEmpty(local_98);
    if (!bVar1) {
      QRectF::topLeft(in_stack_fffffffffffffe68);
      QRectF::bottomLeft(in_stack_fffffffffffffe68);
      ::operator+((QPointF *)in_stack_fffffffffffffe68,(QPointF *)in_stack_fffffffffffffe60);
      ::operator*((QPointF *)in_stack_fffffffffffffe68,(qreal)in_stack_fffffffffffffe60);
      QTransform::map((QTransform *)in_RDI,(QPointF *)in_stack_fffffffffffffe80);
      p2 = (QPointF *)&(pQVar4->super_QPainterState).matrix;
      local_128 = QRectF::topRight(in_stack_fffffffffffffe68);
      local_138 = QRectF::bottomRight(in_stack_fffffffffffffe68);
      ::operator+((QPointF *)in_stack_fffffffffffffe68,p2);
      ::operator*((QPointF *)in_stack_fffffffffffffe68,(qreal)p2);
      QTransform::map((QTransform *)in_RDI,(QPointF *)in_stack_fffffffffffffe80);
      QScopedPointer<QRasterizer,_QScopedPointerDeleter<QRasterizer>_>::operator->
                (&pQVar3->rasterizer);
      QRectF::height(local_98);
      QRectF::width(local_98);
      QRasterizer::rasterizeLine
                (in_stack_00000258,in_stack_00000250,in_stack_00000248,in_stack_00000240,
                 (bool)in_stack_0000023f);
    }
  }
LAB_0056901f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRasterPaintEngine::fillRect(const QRectF &r, QSpanData *data)
{
    Q_D(QRasterPaintEngine);
    QRasterPaintEngineState *s = state();

    if (!s->flags.antialiased) {
        uint txop = s->matrix.type();
        if (txop == QTransform::TxNone) {
            fillRect_normalized(toNormalizedFillRect(r), data, d);
            return;
        } else if (txop == QTransform::TxTranslate) {
            const QRect rr = toNormalizedFillRect(r.translated(s->matrix.dx(), s->matrix.dy()));
            fillRect_normalized(rr, data, d);
            return;
        } else if (txop == QTransform::TxScale) {
            const QRect rr = toNormalizedFillRect(s->matrix.mapRect(r));
            fillRect_normalized(rr, data, d);
            return;
        }
    }
    ensureRasterState();
    if (s->flags.tx_noshear) {
        d->initializeRasterizer(data);
        QRectF nr = r.normalized();
        if (!nr.isEmpty()) {
            const QPointF a = s->matrix.map((nr.topLeft() + nr.bottomLeft()) * 0.5f);
            const QPointF b = s->matrix.map((nr.topRight() + nr.bottomRight()) * 0.5f);
            d->rasterizer->rasterizeLine(a, b, nr.height() / nr.width());
        }
        return;
    }

    QPainterPath path;
    path.addRect(r);
    ensureOutlineMapper();
    fillPath(path, data);
}